

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex
          (CrossingProcessor *this,S2Point *v,CrossingIterator *it)

{
  CrossingIterator *pCVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  S2Shape *pSVar5;
  bool local_1b9;
  bool local_199;
  undefined1 local_178 [24];
  D DStack_160;
  Edge local_148;
  Edge local_118;
  int local_e4;
  ChainInfo *pCStack_e0;
  int b_edge_id;
  ChainInfo *b_chain;
  S2LogMessage local_d0;
  S2LogMessageVoidify local_b9;
  undefined1 local_b8 [48];
  Edge local_88;
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  CrossingIterator *local_28;
  CrossingIterator *it_local;
  S2Point *v_local;
  CrossingProcessor *this_local;
  
  local_28 = it;
  it_local = (CrossingIterator *)v;
  v_local = (S2Point *)this;
  iVar3 = CrossingIterator::b_dimension(it);
  local_41 = 0;
  if (iVar3 != 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x687,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar4 = S2LogMessage::stream(&local_40);
    poVar4 = std::operator<<(poVar4,"Check failed: (1) == (it.b_dimension()) ");
    S2LogMessageVoidify::operator&(&local_29,poVar4);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  CrossingIterator::b_edge(&local_88,local_28);
  bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)&local_88,(D *)it_local);
  b_chain._7_1_ = 0;
  local_199 = true;
  if (!bVar2) {
    CrossingIterator::b_edge((Edge *)local_b8,local_28);
    local_199 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)(local_b8 + 0x18),(D *)it_local);
  }
  if (((local_199 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x688,kFatal,(ostream *)&std::cerr);
    b_chain._7_1_ = 1;
    poVar4 = S2LogMessage::stream(&local_d0);
    poVar4 = std::operator<<(poVar4,"Check failed: it.b_edge().v0 == v || it.b_edge().v1 == v ");
    S2LogMessageVoidify::operator&(&local_b9,poVar4);
  }
  if ((b_chain._7_1_ & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d0);
  }
  if (this->polyline_model_ == CLOSED) {
    this_local._7_1_ = true;
  }
  else {
    pCStack_e0 = CrossingIterator::b_chain_info(local_28);
    local_e4 = CrossingIterator::b_edge_id(local_28);
    pCVar1 = it_local;
    local_1b9 = false;
    if (local_e4 == pCStack_e0->limit + -1) {
      CrossingIterator::b_edge(&local_118,local_28);
      local_1b9 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)pCVar1,&local_118.v1);
    }
    if (local_1b9 == false) {
      bVar2 = polyline_contains_v0(this,local_e4,pCStack_e0->start);
      pCVar1 = it_local;
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        CrossingIterator::b_edge(&local_148,local_28);
        bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                          ((BasicVector<Vector3,_double,_3UL> *)pCVar1,&local_148.v0);
        pCVar1 = it_local;
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else if ((this->polyline_loops_have_boundaries_ & 1U) == 0) {
          pSVar5 = CrossingIterator::b_shape(local_28);
          (*pSVar5->_vptr_S2Shape[8])
                    (local_178,pSVar5,(ulong)(uint)pCStack_e0->chain_id,
                     (ulong)((pCStack_e0->limit - pCStack_e0->start) - 1));
          this_local._7_1_ =
               util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                         ((BasicVector<Vector3,_double,_3UL> *)pCVar1,&DStack_160);
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex(
    const S2Point& v, const CrossingIterator& it) const {
  S2_DCHECK_EQ(1, it.b_dimension());
  S2_DCHECK(it.b_edge().v0 == v || it.b_edge().v1 == v);

  // Closed polylines contain all their vertices.
  if (polyline_model_ == PolylineModel::CLOSED) return true;

  // Note that the code below is structured so that it.b_edge() is not usually
  // needed (since accessing the edge can be relatively expensive).
  const auto& b_chain = it.b_chain_info();
  int b_edge_id = it.b_edge_id();

  // The last polyline vertex is never contained.  (For polyline loops, it is
  // sufficient to treat the first vertex as begin contained.)  This case also
  // handles degenerate polylines (polylines with one edge where v0 == v1),
  // which do not contain any points.
  if (b_edge_id == b_chain.limit - 1 && v == it.b_edge().v1) return false;

  // Otherwise all interior vertices are contained.  The first polyline
  // vertex is contained if either the polyline model is not OPEN, or the
  // polyline forms a loop and polyline_loops_have_boundaries_ is false.
  if (polyline_contains_v0(b_edge_id, b_chain.start)) return true;
  if (v != it.b_edge().v0) return true;
  if (polyline_loops_have_boundaries_) return false;
  return v == it.b_shape().chain_edge(b_chain.chain_id,
                                      b_chain.limit - b_chain.start - 1).v1;
}